

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O2

void __thiscall
cnn::HierarchicalSoftmaxBuilder::HierarchicalSoftmaxBuilder
          (HierarchicalSoftmaxBuilder *this,uint rep_dim,string *cluster_file,Dict *word_dict,
          Model *model)

{
  Cluster *this_00;
  
  (this->super_FactoredSoftmaxBuilder)._vptr_FactoredSoftmaxBuilder =
       (_func_int **)&PTR_new_graph_003a40a0;
  (this->widx2path).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->widx2path).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->widx2path).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Dict::Dict(&this->path_symbols);
  this_00 = ReadClusterFile(this,cluster_file,word_dict);
  this->root = this_00;
  Cluster::initialize(this_00,rep_dim,model);
  return;
}

Assistant:

HierarchicalSoftmaxBuilder::HierarchicalSoftmaxBuilder(unsigned rep_dim,
                             const std::string& cluster_file,
                             Dict* word_dict,
                             Model* model) {
  root = ReadClusterFile(cluster_file, word_dict);
  root->initialize(rep_dim, model);
}